

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_parser.cpp
# Opt level: O3

void __thiscall Arithmetic_FoldUnary_Test::TestBody(Arithmetic_FoldUnary_Test *this)

{
  BcOp BVar1;
  long *plVar2;
  AssertionResult *this_00;
  char *pcVar3;
  char *in_R9;
  bool bVar4;
  undefined1 local_178 [8];
  MockParser mock;
  undefined1 local_50 [8];
  AssertionResult gtest_ar;
  undefined1 local_30 [8];
  AssertionResult gtest_ar_;
  
  MockParser::MockParser((MockParser *)local_178,"let a = -3\nlet b = --4\nlet c = ---5\n");
  bVar4 = mock.cur_fn < (ulong)(long)*(int *)(mock.vm._8_8_ + 0x10 + mock.vm._264_8_ * 0x18);
  local_30[0] = bVar4;
  gtest_ar_.success_ = false;
  gtest_ar_._1_7_ = 0;
  if (!bVar4) {
    testing::Message::Message((Message *)&gtest_ar_.message_);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_50,(internal *)local_30,
               (AssertionResult *)"mock.cur_ins < mock.vm.fns[mock.cur_fn].ins_count","false","true"
               ,in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&mock.cur_ins,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
               ,0xbc,(char *)CONCAT71(local_50._1_7_,local_50[0]));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&mock.cur_ins,(Message *)&gtest_ar_.message_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&mock.cur_ins);
    if ((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)CONCAT71(local_50._1_7_,local_50[0]) != &gtest_ar.message_) {
      operator_delete((undefined1 *)CONCAT71(local_50._1_7_,local_50[0]),
                      (ulong)((long)&((gtest_ar.message_.ptr_)->_M_dataplus)._M_p + 1));
    }
    if (CONCAT44(gtest_ar_.message_.ptr_._4_4_,
                 CONCAT22(gtest_ar_.message_.ptr_._2_2_,
                          CONCAT11(gtest_ar_.message_.ptr_._1_1_,gtest_ar_.message_.ptr_._0_1_))) !=
        0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) &&
         (plVar2 = (long *)CONCAT44(gtest_ar_.message_.ptr_._4_4_,
                                    CONCAT22(gtest_ar_.message_.ptr_._2_2_,
                                             CONCAT11(gtest_ar_.message_.ptr_._1_1_,
                                                      gtest_ar_.message_.ptr_._0_1_))),
         plVar2 != (long *)0x0)) {
        (**(code **)(*plVar2 + 8))();
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    goto LAB_00114d1d;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&gtest_ar_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  BVar1 = *(BcOp *)(*(long *)(mock.vm._8_8_ + 8 + mock.vm._264_8_ * 0x18) + mock.cur_fn * 4);
  local_30._0_4_ = BVar1 & 0xff;
  gtest_ar_.message_.ptr_._0_1_ = 1;
  gtest_ar_.message_.ptr_._1_1_ = 0;
  gtest_ar_.message_.ptr_._2_2_ = 0;
  mock.cur_fn = mock.cur_fn + 1;
  testing::internal::CmpHelperEQ<BcOp,BcOp>
            ((internal *)local_50,"bc_op(ins)","BC_SET_N",(BcOp *)local_30,
             (BcOp *)&gtest_ar_.message_);
  if (local_50[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_30);
    if (gtest_ar._0_8_ == 0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
               ,0xbc,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    if (CONCAT44(local_30._4_4_,local_30._0_4_) != 0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && ((long *)CONCAT44(local_30._4_4_,local_30._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_30._4_4_,local_30._0_4_) + 8))();
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    goto LAB_00114d1d;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  gtest_ar_.message_.ptr_._0_1_ = (undefined1)(BVar1 >> 8);
  local_30._0_4_ = BC_MOV;
  testing::internal::CmpHelperEQ<unsigned_char,int>
            ((internal *)local_50,"bc_arg1(ins)","0",(uchar *)&gtest_ar_.message_,(int *)local_30);
  if (local_50[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_30);
    if (gtest_ar._0_8_ == 0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
               ,0xbc,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    if (CONCAT44(local_30._4_4_,local_30._0_4_) != 0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && ((long *)CONCAT44(local_30._4_4_,local_30._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_30._4_4_,local_30._0_4_) + 8))();
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    goto LAB_00114d1d;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  gtest_ar_.message_.ptr_._0_1_ = (undefined1)(BVar1 >> 0x10);
  gtest_ar_.message_.ptr_._1_1_ = (undefined1)(BVar1 >> 0x18);
  local_30._0_4_ = BC_MOV;
  testing::internal::CmpHelperEQ<unsigned_short,int>
            ((internal *)local_50,"bc_arg16(ins)","0",(unsigned_short *)&gtest_ar_.message_,
             (int *)local_30);
  if (local_50[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_30);
    if (gtest_ar._0_8_ == 0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
               ,0xbc,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    if (CONCAT44(local_30._4_4_,local_30._0_4_) != 0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && ((long *)CONCAT44(local_30._4_4_,local_30._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_30._4_4_,local_30._0_4_) + 8))();
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    goto LAB_00114d1d;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar4 = mock.cur_fn < (ulong)(long)*(int *)(mock.vm._8_8_ + 0x10 + mock.vm._264_8_ * 0x18);
  local_30[0] = bVar4;
  gtest_ar_.success_ = false;
  gtest_ar_._1_7_ = 0;
  if (!bVar4) {
    testing::Message::Message((Message *)&gtest_ar_.message_);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_50,(internal *)local_30,
               (AssertionResult *)"mock.cur_ins < mock.vm.fns[mock.cur_fn].ins_count","false","true"
               ,in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&mock.cur_ins,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
               ,0xbd,(char *)CONCAT71(local_50._1_7_,local_50[0]));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&mock.cur_ins,(Message *)&gtest_ar_.message_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&mock.cur_ins);
    if ((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)CONCAT71(local_50._1_7_,local_50[0]) != &gtest_ar.message_) {
      operator_delete((undefined1 *)CONCAT71(local_50._1_7_,local_50[0]),
                      (ulong)((long)&((gtest_ar.message_.ptr_)->_M_dataplus)._M_p + 1));
    }
    if (CONCAT44(gtest_ar_.message_.ptr_._4_4_,
                 CONCAT22(gtest_ar_.message_.ptr_._2_2_,
                          CONCAT11(gtest_ar_.message_.ptr_._1_1_,gtest_ar_.message_.ptr_._0_1_))) !=
        0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) &&
         (plVar2 = (long *)CONCAT44(gtest_ar_.message_.ptr_._4_4_,
                                    CONCAT22(gtest_ar_.message_.ptr_._2_2_,
                                             CONCAT11(gtest_ar_.message_.ptr_._1_1_,
                                                      gtest_ar_.message_.ptr_._0_1_))),
         plVar2 != (long *)0x0)) {
        (**(code **)(*plVar2 + 8))();
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    goto LAB_00114d1d;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&gtest_ar_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  BVar1 = *(BcOp *)(*(long *)(mock.vm._8_8_ + 8 + mock.vm._264_8_ * 0x18) + mock.cur_fn * 4);
  local_30._0_4_ = BVar1 & 0xff;
  gtest_ar_.message_.ptr_._0_1_ = 1;
  gtest_ar_.message_.ptr_._1_1_ = 0;
  gtest_ar_.message_.ptr_._2_2_ = 0;
  mock.cur_fn = mock.cur_fn + 1;
  testing::internal::CmpHelperEQ<BcOp,BcOp>
            ((internal *)local_50,"bc_op(ins)","BC_SET_N",(BcOp *)local_30,
             (BcOp *)&gtest_ar_.message_);
  if (local_50[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_30);
    if (gtest_ar._0_8_ == 0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
               ,0xbd,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    if (CONCAT44(local_30._4_4_,local_30._0_4_) != 0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && ((long *)CONCAT44(local_30._4_4_,local_30._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_30._4_4_,local_30._0_4_) + 8))();
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    goto LAB_00114d1d;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  gtest_ar_.message_.ptr_._0_1_ = (undefined1)(BVar1 >> 8);
  local_30._0_4_ = BC_SET_N;
  testing::internal::CmpHelperEQ<unsigned_char,int>
            ((internal *)local_50,"bc_arg1(ins)","1",(uchar *)&gtest_ar_.message_,(int *)local_30);
  if (local_50[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_30);
    if (gtest_ar._0_8_ == 0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
               ,0xbd,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    if (CONCAT44(local_30._4_4_,local_30._0_4_) != 0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && ((long *)CONCAT44(local_30._4_4_,local_30._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_30._4_4_,local_30._0_4_) + 8))();
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    goto LAB_00114d1d;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  gtest_ar_.message_.ptr_._0_1_ = (undefined1)(BVar1 >> 0x10);
  gtest_ar_.message_.ptr_._1_1_ = (undefined1)(BVar1 >> 0x18);
  local_30._0_4_ = BC_SET_N;
  testing::internal::CmpHelperEQ<unsigned_short,int>
            ((internal *)local_50,"bc_arg16(ins)","1",(unsigned_short *)&gtest_ar_.message_,
             (int *)local_30);
  if (local_50[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_30);
    if (gtest_ar._0_8_ == 0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
               ,0xbd,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    if (CONCAT44(local_30._4_4_,local_30._0_4_) != 0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && ((long *)CONCAT44(local_30._4_4_,local_30._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_30._4_4_,local_30._0_4_) + 8))();
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    goto LAB_00114d1d;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar4 = mock.cur_fn < (ulong)(long)*(int *)(mock.vm._8_8_ + 0x10 + mock.vm._264_8_ * 0x18);
  local_30[0] = bVar4;
  gtest_ar_.success_ = false;
  gtest_ar_._1_7_ = 0;
  if (!bVar4) {
    testing::Message::Message((Message *)&gtest_ar_.message_);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_50,(internal *)local_30,
               (AssertionResult *)"mock.cur_ins < mock.vm.fns[mock.cur_fn].ins_count","false","true"
               ,in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&mock.cur_ins,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
               ,0xbe,(char *)CONCAT71(local_50._1_7_,local_50[0]));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&mock.cur_ins,(Message *)&gtest_ar_.message_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&mock.cur_ins);
    if ((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)CONCAT71(local_50._1_7_,local_50[0]) != &gtest_ar.message_) {
      operator_delete((undefined1 *)CONCAT71(local_50._1_7_,local_50[0]),
                      (ulong)((long)&((gtest_ar.message_.ptr_)->_M_dataplus)._M_p + 1));
    }
    if (CONCAT44(gtest_ar_.message_.ptr_._4_4_,
                 CONCAT22(gtest_ar_.message_.ptr_._2_2_,
                          CONCAT11(gtest_ar_.message_.ptr_._1_1_,gtest_ar_.message_.ptr_._0_1_))) !=
        0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) &&
         (plVar2 = (long *)CONCAT44(gtest_ar_.message_.ptr_._4_4_,
                                    CONCAT22(gtest_ar_.message_.ptr_._2_2_,
                                             CONCAT11(gtest_ar_.message_.ptr_._1_1_,
                                                      gtest_ar_.message_.ptr_._0_1_))),
         plVar2 != (long *)0x0)) {
        (**(code **)(*plVar2 + 8))();
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    goto LAB_00114d1d;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&gtest_ar_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  BVar1 = *(BcOp *)(*(long *)(mock.vm._8_8_ + 8 + mock.vm._264_8_ * 0x18) + mock.cur_fn * 4);
  local_30._0_4_ = BVar1 & 0xff;
  gtest_ar_.message_.ptr_._0_1_ = 1;
  gtest_ar_.message_.ptr_._1_1_ = 0;
  gtest_ar_.message_.ptr_._2_2_ = 0;
  mock.cur_fn = mock.cur_fn + 1;
  testing::internal::CmpHelperEQ<BcOp,BcOp>
            ((internal *)local_50,"bc_op(ins)","BC_SET_N",(BcOp *)local_30,
             (BcOp *)&gtest_ar_.message_);
  if (local_50[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_30);
    if (gtest_ar._0_8_ == 0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
               ,0xbe,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    if (CONCAT44(local_30._4_4_,local_30._0_4_) != 0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && ((long *)CONCAT44(local_30._4_4_,local_30._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_30._4_4_,local_30._0_4_) + 8))();
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    goto LAB_00114d1d;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  gtest_ar_.message_.ptr_._0_1_ = (undefined1)(BVar1 >> 8);
  local_30._0_4_ = BC_SET_P;
  testing::internal::CmpHelperEQ<unsigned_char,int>
            ((internal *)local_50,"bc_arg1(ins)","2",(uchar *)&gtest_ar_.message_,(int *)local_30);
  if (local_50[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_30);
    if (gtest_ar._0_8_ == 0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
               ,0xbe,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    if (CONCAT44(local_30._4_4_,local_30._0_4_) != 0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && ((long *)CONCAT44(local_30._4_4_,local_30._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_30._4_4_,local_30._0_4_) + 8))();
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    goto LAB_00114d1d;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  gtest_ar_.message_.ptr_._0_1_ = (undefined1)(BVar1 >> 0x10);
  gtest_ar_.message_.ptr_._1_1_ = (undefined1)(BVar1 >> 0x18);
  local_30._0_4_ = BC_SET_P;
  testing::internal::CmpHelperEQ<unsigned_short,int>
            ((internal *)local_50,"bc_arg16(ins)","2",(unsigned_short *)&gtest_ar_.message_,
             (int *)local_30);
  if (local_50[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_30);
    if (gtest_ar._0_8_ == 0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
               ,0xbe,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    if (CONCAT44(local_30._4_4_,local_30._0_4_) != 0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && ((long *)CONCAT44(local_30._4_4_,local_30._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_30._4_4_,local_30._0_4_) + 8))();
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    goto LAB_00114d1d;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar4 = mock.cur_fn < (ulong)(long)*(int *)(mock.vm._8_8_ + 0x10 + mock.vm._264_8_ * 0x18);
  local_30[0] = bVar4;
  gtest_ar_.success_ = false;
  gtest_ar_._1_7_ = 0;
  if (bVar4) {
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_30);
    BVar1 = *(BcOp *)(*(long *)(mock.vm._8_8_ + 8 + mock.vm._264_8_ * 0x18) + mock.cur_fn * 4);
    local_30._0_4_ = BVar1 & 0xff;
    gtest_ar_.message_.ptr_._0_1_ = 0x20;
    gtest_ar_.message_.ptr_._1_1_ = 0;
    gtest_ar_.message_.ptr_._2_2_ = 0;
    mock.cur_fn = mock.cur_fn + 1;
    testing::internal::CmpHelperEQ<BcOp,BcOp>
              ((internal *)local_50,"bc_op(ins)","BC_RET",(BcOp *)local_30,
               (BcOp *)&gtest_ar_.message_);
    if (local_50[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_30);
      if (gtest_ar._0_8_ == 0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                 ,0xbf,pcVar3);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
LAB_00115298:
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
      testing::Message::~Message((Message *)local_30);
    }
    else {
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
      gtest_ar_.message_.ptr_._0_1_ = (undefined1)(BVar1 >> 8);
      local_30._0_4_ = BC_MOV;
      testing::internal::CmpHelperEQ<unsigned_char,int>
                ((internal *)local_50,"bc_arg1(ins)","0",(uchar *)&gtest_ar_.message_,
                 (int *)local_30);
      if (local_50[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_30);
        if (gtest_ar._0_8_ == 0) {
          pcVar3 = "";
        }
        else {
          pcVar3 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0xbf,pcVar3);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
        goto LAB_00115298;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
      gtest_ar_.message_.ptr_._0_1_ = (undefined1)(BVar1 >> 0x10);
      local_30._0_4_ = BC_MOV;
      testing::internal::CmpHelperEQ<unsigned_char,int>
                ((internal *)local_50,"bc_arg2(ins)","0",(uchar *)&gtest_ar_.message_,
                 (int *)local_30);
      if (local_50[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_30);
        if (gtest_ar._0_8_ == 0) {
          pcVar3 = "";
        }
        else {
          pcVar3 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0xbf,pcVar3);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
        goto LAB_00115298;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
      gtest_ar_.message_.ptr_._0_1_ = (undefined1)(BVar1 >> 0x18);
      local_30._0_4_ = BC_MOV;
      testing::internal::CmpHelperEQ<unsigned_char,int>
                ((internal *)local_50,"bc_arg3(ins)","0",(uchar *)&gtest_ar_.message_,
                 (int *)local_30);
      if (local_50[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_30);
        if (gtest_ar._0_8_ == 0) {
          pcVar3 = "";
        }
        else {
          pcVar3 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0xbf,pcVar3);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
        goto LAB_00115298;
      }
    }
    this_00 = (AssertionResult *)local_50;
  }
  else {
    testing::Message::Message((Message *)&gtest_ar_.message_);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_50,(internal *)local_30,
               (AssertionResult *)"mock.cur_ins < mock.vm.fns[mock.cur_fn].ins_count","false","true"
               ,in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&mock.cur_ins,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
               ,0xbf,(char *)CONCAT71(local_50._1_7_,local_50[0]));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&mock.cur_ins,(Message *)&gtest_ar_.message_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&mock.cur_ins);
    if ((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)CONCAT71(local_50._1_7_,local_50[0]) != &gtest_ar.message_) {
      operator_delete((undefined1 *)CONCAT71(local_50._1_7_,local_50[0]),
                      (ulong)((long)&((gtest_ar.message_.ptr_)->_M_dataplus)._M_p + 1));
    }
    testing::Message::~Message((Message *)&gtest_ar_.message_);
    this_00 = (AssertionResult *)local_30;
  }
  testing::AssertionResult::~AssertionResult(this_00);
LAB_00114d1d:
  vm_free((VM *)local_178);
  return;
}

Assistant:

TEST(Arithmetic, FoldUnary) {
	MockParser mock(
		"let a = -3\n"
		"let b = --4\n"
		"let c = ---5\n"
	);

	INS2(BC_SET_N, 0, 0);
	INS2(BC_SET_N, 1, 1);
	INS2(BC_SET_N, 2, 2);
	INS(BC_RET, 0, 0, 0);
}